

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t
check_req_attr(exr_context_t ctxt,exr_priv_part_t curpart,_internal_exr_seq_scratch *scratch,
              char *aname,char *tname,int32_t attrsz)

{
  int iVar1;
  exr_result_t eVar2;
  exr_context_t in_RCX;
  char *tname_00;
  exr_priv_part_t in_RDX;
  exr_context_t in_RSI;
  exr_priv_part_t in_RDI;
  exr_priv_part_t in_R8;
  int32_t in_R9D;
  int32_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  tname_00 = (char *)(ulong)((int)(char)in_RCX->mode - 99);
  switch(tname_00) {
  case (char *)0x0:
    iVar1 = strcmp((char *)in_RCX,"channels");
    if (iVar1 == 0) {
      eVar2 = check_populate_channels
                        ((exr_context_t)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                         (_internal_exr_seq_scratch *)in_RSI,(char *)in_RDX,
                         (int32_t)((ulong)in_RCX >> 0x20));
      return eVar2;
    }
    iVar1 = strcmp((char *)in_RCX,"compression");
    if (iVar1 == 0) {
      eVar2 = check_populate_compression
                        (in_RSI,in_RDX,(_internal_exr_seq_scratch *)in_RCX,(char *)in_R8,in_R9D);
      return eVar2;
    }
    iVar1 = strcmp((char *)in_RCX,"chunkCount");
    if (iVar1 == 0) {
      eVar2 = check_populate_chunk_count
                        (in_RCX,in_R8,
                         (_internal_exr_seq_scratch *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                         tname_00,in_stack_ffffffffffffffbc);
      return eVar2;
    }
    break;
  case (char *)0x1:
    iVar1 = strcmp((char *)in_RCX,"dataWindow");
    if (iVar1 == 0) {
      eVar2 = check_populate_dataWindow
                        (in_RSI,in_RDX,(_internal_exr_seq_scratch *)in_RCX,(char *)in_R8,in_R9D);
      return eVar2;
    }
    iVar1 = strcmp((char *)in_RCX,"displayWindow");
    if (iVar1 == 0) {
      eVar2 = check_populate_displayWindow
                        (in_RSI,in_RDX,(_internal_exr_seq_scratch *)in_RCX,(char *)in_R8,in_R9D);
      return eVar2;
    }
    break;
  default:
    break;
  case (char *)0x9:
    iVar1 = strcmp((char *)in_RCX,"lineOrder");
    if (iVar1 == 0) {
      eVar2 = check_populate_lineOrder
                        (in_RSI,in_RDX,(_internal_exr_seq_scratch *)in_RCX,(char *)in_R8,in_R9D);
      return eVar2;
    }
    break;
  case (char *)0xb:
    iVar1 = strcmp((char *)in_RCX,"name");
    if (iVar1 == 0) {
      eVar2 = check_populate_name(in_RSI,in_RDX,(_internal_exr_seq_scratch *)in_RCX,(char *)in_R8,
                                  in_R9D);
      return eVar2;
    }
    break;
  case (char *)0xd:
    iVar1 = strcmp((char *)in_RCX,"pixelAspectRatio");
    if (iVar1 == 0) {
      eVar2 = check_populate_pixelAspectRatio
                        (in_RSI,in_RDX,(_internal_exr_seq_scratch *)in_RCX,(char *)in_R8,in_R9D);
      return eVar2;
    }
    break;
  case (char *)0x10:
    iVar1 = strcmp((char *)in_RCX,"screenWindowCenter");
    if (iVar1 == 0) {
      eVar2 = check_populate_screenWindowCenter
                        (in_RSI,in_RDX,(_internal_exr_seq_scratch *)in_RCX,(char *)in_R8,in_R9D);
      return eVar2;
    }
    iVar1 = strcmp((char *)in_RCX,"screenWindowWidth");
    if (iVar1 == 0) {
      eVar2 = check_populate_screenWindowWidth
                        (in_RSI,in_RDX,(_internal_exr_seq_scratch *)in_RCX,(char *)in_R8,in_R9D);
      return eVar2;
    }
    break;
  case (char *)0x11:
    iVar1 = strcmp((char *)in_RCX,"tiles");
    if (iVar1 == 0) {
      eVar2 = check_populate_tiles
                        (in_RSI,in_RDX,(_internal_exr_seq_scratch *)in_RCX,(char *)in_R8,in_R9D);
      return eVar2;
    }
    iVar1 = strcmp((char *)in_RCX,"type");
    if (iVar1 == 0) {
      eVar2 = check_populate_type(in_RSI,in_RDX,(_internal_exr_seq_scratch *)in_RCX,(char *)in_R8,
                                  in_R9D);
      return eVar2;
    }
    break;
  case (char *)0x13:
    iVar1 = strcmp((char *)in_RCX,"version");
    if (iVar1 == 0) {
      eVar2 = check_populate_version
                        (in_RCX,in_R8,
                         (_internal_exr_seq_scratch *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                         tname_00,in_stack_ffffffffffffffbc);
      return eVar2;
    }
  }
  return 0x21;
}

Assistant:

static exr_result_t
check_req_attr (
    exr_context_t                     ctxt,
    exr_priv_part_t                   curpart,
    struct _internal_exr_seq_scratch* scratch,
    const char*                       aname,
    const char*                       tname,
    int32_t                           attrsz)
{
    switch (aname[0])
    {
        case 'c':
            if (0 == strcmp (aname, EXR_REQ_CHANNELS_STR))
                return check_populate_channels (
                    ctxt, curpart, scratch, tname, attrsz);
            if (0 == strcmp (aname, EXR_REQ_COMP_STR))
                return check_populate_compression (
                    ctxt, curpart, scratch, tname, attrsz);
            if (0 == strcmp (aname, EXR_REQ_CHUNK_COUNT_STR))
                return check_populate_chunk_count (
                    ctxt, curpart, scratch, tname, attrsz);
            break;
        case 'd':
            if (0 == strcmp (aname, EXR_REQ_DATA_STR))
                return check_populate_dataWindow (
                    ctxt, curpart, scratch, tname, attrsz);
            if (0 == strcmp (aname, EXR_REQ_DISP_STR))
                return check_populate_displayWindow (
                    ctxt, curpart, scratch, tname, attrsz);
            break;
        case 'l':
            if (0 == strcmp (aname, EXR_REQ_LO_STR))
                return check_populate_lineOrder (
                    ctxt, curpart, scratch, tname, attrsz);
            break;
        case 'n':
            if (0 == strcmp (aname, EXR_REQ_NAME_STR))
                return check_populate_name (
                    ctxt, curpart, scratch, tname, attrsz);
            break;
        case 'p':
            if (0 == strcmp (aname, EXR_REQ_PAR_STR))
                return check_populate_pixelAspectRatio (
                    ctxt, curpart, scratch, tname, attrsz);
            break;
        case 's':
            if (0 == strcmp (aname, EXR_REQ_SCR_WC_STR))
                return check_populate_screenWindowCenter (
                    ctxt, curpart, scratch, tname, attrsz);
            if (0 == strcmp (aname, EXR_REQ_SCR_WW_STR))
                return check_populate_screenWindowWidth (
                    ctxt, curpart, scratch, tname, attrsz);
            break;
        case 't':
            if (0 == strcmp (aname, EXR_REQ_TILES_STR))
                return check_populate_tiles (
                    ctxt, curpart, scratch, tname, attrsz);
            if (0 == strcmp (aname, EXR_REQ_TYPE_STR))
                return check_populate_type (
                    ctxt, curpart, scratch, tname, attrsz);
            break;
        case 'v':
            if (0 == strcmp (aname, EXR_REQ_VERSION_STR))
                return check_populate_version (
                    ctxt, curpart, scratch, tname, attrsz);
            break;
        default: break;
    }

    return EXR_ERR_UNKNOWN;
}